

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O2

Result * validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetwork>
                   (Result *__return_storage_ptr__,NeuralNetwork *nn)

{
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  string *this_00;
  pointer ppLVar1;
  LayerNode *pLVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  Type *pTVar6;
  size_type sVar7;
  NetworkUpdateParameters *pNVar8;
  long lVar9;
  Type *pTVar10;
  LayerNode *pLVar11;
  iterator iVar12;
  int i;
  int iVar13;
  int j;
  Optimizer *optimizer;
  pointer ppLVar14;
  string layerName;
  string firstNonBackpropogabaleLayerSeen;
  string err_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  visitedLayersSet;
  vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> layerNodes;
  string err_4;
  Result r;
  size_type local_1b0;
  string lossLayerName_1;
  string err;
  _Rb_tree_node_base local_f8;
  size_t local_d8;
  string local_d0;
  string currentNodeName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string err_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(__return_storage_ptr__);
  CoreML::Result::Result(&r);
  this = &nn->layers_;
  bVar4 = false;
  for (iVar13 = 0; iVar13 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_;
      iVar13 = iVar13 + 1) {
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                       (&this->super_RepeatedPtrFieldBase,iVar13);
    if (pTVar6->isupdatable_ == true) {
      if ((pTVar6->_oneof_case_[0] != 100) && (pTVar6->_oneof_case_[0] != 0x8c)) {
        err._M_dataplus._M_p = (pointer)&err.field_2;
        err._M_string_length = 0;
        err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::operator+(&layerName,"The layer named \'",(pTVar6->name_).ptr_);
        std::operator+(&err_1,&layerName,
                       "\' is marked as updatable, however, it is not supported as the type of this layer is neither convolution nor inner-product."
                      );
        std::__cxx11::string::operator=((string *)&err,(string *)&err_1);
        std::__cxx11::string::~string((string *)&err_1);
        std::__cxx11::string::~string((string *)&layerName);
        CoreML::Result::Result((Result *)&visitedLayersSet,INVALID_UPDATABLE_MODEL_PARAMETERS,&err);
        goto LAB_005671d7;
      }
      validateWeightParamsUpdatable((Result *)&err,pTVar6);
      CoreML::Result::operator=(&r,(Result *)&err);
      std::__cxx11::string::~string((string *)&err._M_string_length);
      bVar3 = CoreML::Result::good(&r);
      bVar4 = true;
      if (!bVar3) goto LAB_005670ff;
    }
  }
  if (bVar4) {
LAB_005670ff:
    CoreML::Result::Result((Result *)&visitedLayersSet,&r);
  }
  else {
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::assign((char *)&err);
    CoreML::Result::Result((Result *)&visitedLayersSet,INVALID_UPDATABLE_MODEL_PARAMETERS,&err);
LAB_005671d7:
    std::__cxx11::string::~string((string *)&err);
  }
  this_00 = &r.m_message;
  std::__cxx11::string::~string((string *)this_00);
  CoreML::Result::operator=(__return_storage_ptr__,(Result *)&visitedLayersSet);
  std::__cxx11::string::~string((string *)&visitedLayersSet._M_t._M_impl.super__Rb_tree_header);
  bVar4 = CoreML::Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  CoreML::Result::Result((Result *)&err);
  r.m_message._M_dataplus._M_p = (pointer)((ulong)r.m_message._M_dataplus._M_p._4_4_ << 0x20);
  r.m_message._M_string_length = 0;
  err_1._M_dataplus._M_p = (pointer)&err_1.field_2;
  err_1._M_string_length = 0;
  err_1.field_2._M_local_buf[0] = '\0';
  iVar13 = 0;
  r.m_message.field_2._M_allocated_capacity = (size_type)this_00;
  r.m_message.field_2._8_8_ = this_00;
  do {
    if ((nn->layers_).super_RepeatedPtrFieldBase.current_size_ <= iVar13) {
      pNVar8 = nn->updateparams_;
      if (pNVar8 == (NetworkUpdateParameters *)0x0) {
        pNVar8 = (NetworkUpdateParameters *)
                 &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
      }
      iVar13 = 0;
      goto LAB_0056735c;
    }
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                       (&this->super_RepeatedPtrFieldBase,iVar13);
    std::__cxx11::string::string((string *)&layerName,(string *)(pTVar6->name_).ptr_);
    sVar7 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&r,&layerName);
    if (sVar7 == 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&r,&layerName);
    }
    else {
      std::operator+(&firstNonBackpropogabaleLayerSeen,
                     "The updatable model has a name collision for: \'",&layerName);
      std::operator+(&lossLayerName_1,&firstNonBackpropogabaleLayerSeen,
                     "\', i.e., there are more than one layers or loss layers with this name.");
      std::__cxx11::string::operator=((string *)&err_1,(string *)&lossLayerName_1);
      std::__cxx11::string::~string((string *)&lossLayerName_1);
      std::__cxx11::string::~string((string *)&firstNonBackpropogabaleLayerSeen);
      CoreML::Result::Result((Result *)&visitedLayersSet,INVALID_UPDATABLE_MODEL_PARAMETERS,&err_1);
    }
    std::__cxx11::string::~string((string *)&layerName);
    iVar13 = iVar13 + 1;
  } while (sVar7 == 0);
  goto LAB_0056743d;
code_r0x00567603:
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(pNVar8->losslayers_).super_RepeatedPtrFieldBase,iVar13);
  CoreML::LayerNode::LayerNode((LayerNode *)&r,pTVar10);
  std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::
  emplace_back<CoreML::LayerNode>(&layerNodes,(LayerNode *)&r);
  CoreML::LayerNode::~LayerNode((LayerNode *)&r);
  CoreML::NeuralNetworkValidatorGraph::insertNode
            ((NeuralNetworkValidatorGraph *)&err,
             layerNodes.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1);
  validateLossLayer(&r,pTVar10,(NeuralNetworkValidatorGraph *)&err);
  CoreML::Result::operator=((Result *)&err_1,&r);
  std::__cxx11::string::~string((string *)&r.m_message);
  bVar4 = CoreML::Result::good((Result *)&err_1);
  iVar13 = iVar13 + 1;
  if (!bVar4) goto code_r0x00567681;
  goto LAB_005675e5;
code_r0x00567681:
  CoreML::Result::Result((Result *)&layerName,(Result *)&err_1);
LAB_00567ab6:
  std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::~vector(&layerNodes);
  CoreML::NeuralNetworkValidatorGraph::~NeuralNetworkValidatorGraph
            ((NeuralNetworkValidatorGraph *)&err);
  goto LAB_00567ad0;
  while( true ) {
    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                        (&(pNVar8->losslayers_).super_RepeatedPtrFieldBase,iVar13);
    std::__cxx11::string::string((string *)&layerName,(string *)(pTVar10->name_).ptr_);
    sVar7 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&r,&layerName);
    if (sVar7 == 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&r,&layerName);
    }
    else {
      std::operator+(&firstNonBackpropogabaleLayerSeen,
                     "The updatable model has a name collision for: \'",&layerName);
      std::operator+(&lossLayerName_1,&firstNonBackpropogabaleLayerSeen,
                     "\', i.e., there are more than one layers or loss layers with this name.");
      std::__cxx11::string::operator=((string *)&err_1,(string *)&lossLayerName_1);
      std::__cxx11::string::~string((string *)&lossLayerName_1);
      std::__cxx11::string::~string((string *)&firstNonBackpropogabaleLayerSeen);
      CoreML::Result::Result((Result *)&visitedLayersSet,INVALID_UPDATABLE_MODEL_PARAMETERS,&err_1);
    }
    std::__cxx11::string::~string((string *)&layerName);
    iVar13 = iVar13 + 1;
    if (sVar7 != 0) break;
LAB_0056735c:
    if ((pNVar8->losslayers_).super_RepeatedPtrFieldBase.current_size_ <= iVar13) {
      CoreML::Result::Result((Result *)&visitedLayersSet,(Result *)&err);
      break;
    }
  }
LAB_0056743d:
  std::__cxx11::string::~string((string *)&err_1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&r);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  CoreML::Result::operator=(__return_storage_ptr__,(Result *)&visitedLayersSet);
  std::__cxx11::string::~string((string *)&visitedLayersSet._M_t._M_impl.super__Rb_tree_header);
  bVar4 = CoreML::Result::good(__return_storage_ptr__);
  if (bVar4) {
    CoreML::Result::Result((Result *)&err_1);
    pNVar8 = nn->updateparams_;
    if (pNVar8 == (NetworkUpdateParameters *)0x0) {
      pNVar8 = (NetworkUpdateParameters *)
               &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    lVar9 = (long)(pNVar8->losslayers_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar9 < 2) {
      local_f8._M_left = &local_f8;
      err._M_string_length = err._M_string_length & 0xffffffff00000000;
      err.field_2._M_allocated_capacity = 0;
      local_f8._M_color = _S_red;
      local_f8._M_parent = (_Base_ptr)0x0;
      local_d8 = 0;
      layerNodes.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      layerNodes.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      layerNodes.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      err.field_2._8_8_ = &err._M_string_length;
      local_f8._M_right = local_f8._M_left;
      std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::resize
                (&layerNodes,(nn->layers_).super_RepeatedPtrFieldBase.current_size_ + lVar9);
      for (iVar13 = 0; iVar13 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_;
          iVar13 = iVar13 + 1) {
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                           (&this->super_RepeatedPtrFieldBase,iVar13);
        CoreML::LayerNode::LayerNode((LayerNode *)&r,pTVar6);
        std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::
        emplace_back<CoreML::LayerNode>(&layerNodes,(LayerNode *)&r);
        CoreML::LayerNode::~LayerNode((LayerNode *)&r);
        CoreML::NeuralNetworkValidatorGraph::insertNode
                  ((NeuralNetworkValidatorGraph *)&err,
                   layerNodes.
                   super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl
                   .super__Vector_impl_data._M_finish + -1);
      }
      iVar13 = 0;
LAB_005675e5:
      pNVar8 = nn->updateparams_;
      if (pNVar8 == (NetworkUpdateParameters *)0x0) {
        pNVar8 = (NetworkUpdateParameters *)
                 &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
      }
      if (iVar13 < (pNVar8->losslayers_).super_RepeatedPtrFieldBase.current_size_)
      goto code_r0x00567603;
      optimizer = pNVar8->optimizer_;
      if (optimizer == (Optimizer *)0x0) {
        optimizer = (Optimizer *)&CoreML::Specification::_Optimizer_default_instance_;
      }
      validateOptimizer(&r,optimizer);
      CoreML::Result::operator=((Result *)&err_1,&r);
      std::__cxx11::string::~string((string *)&r.m_message);
      bVar4 = CoreML::Result::good((Result *)&err_1);
      if (bVar4) {
        pNVar8 = nn->updateparams_;
        if (pNVar8 == (NetworkUpdateParameters *)0x0) {
          pNVar8 = (NetworkUpdateParameters *)
                   &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
        }
        validateOtherTopLevelUpdateParameters(&r,pNVar8);
        CoreML::Result::operator=((Result *)&err_1,&r);
        std::__cxx11::string::~string((string *)&r.m_message);
        bVar4 = CoreML::Result::good((Result *)&err_1);
        if (!bVar4) goto LAB_00567a74;
        visitedLayersSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        visitedLayersSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        visitedLayersSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &visitedLayersSet._M_t._M_impl.super__Rb_tree_header._M_header;
        visitedLayersSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        iVar13 = 0;
        visitedLayersSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             visitedLayersSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          pNVar8 = nn->updateparams_;
          if (pNVar8 == (NetworkUpdateParameters *)0x0) {
            pNVar8 = (NetworkUpdateParameters *)
                     &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
          }
          if ((pNVar8->losslayers_).super_RepeatedPtrFieldBase.current_size_ <= iVar13) break;
          pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                              (&(pNVar8->losslayers_).super_RepeatedPtrFieldBase,iVar13);
          std::__cxx11::string::string((string *)&lossLayerName_1,(string *)(pTVar10->name_).ptr_);
          std::
          queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
                    ((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&r);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&r,&lossLayerName_1);
          firstNonBackpropogabaleLayerSeen._M_dataplus._M_p =
               (pointer)&firstNonBackpropogabaleLayerSeen.field_2;
          firstNonBackpropogabaleLayerSeen._M_string_length = 0;
          firstNonBackpropogabaleLayerSeen.field_2._M_local_buf[0] = '\0';
          bVar5 = 0;
          while( true ) {
            if (local_1b0 == r.m_message._M_string_length) break;
            std::__cxx11::string::string
                      ((string *)&currentNodeName,(string *)r.m_message._M_string_length);
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&r);
            std::__cxx11::string::string((string *)&local_d0,(string *)&currentNodeName);
            pLVar11 = CoreML::NeuralNetworkValidatorGraph::getNodeFromName
                                ((NeuralNetworkValidatorGraph *)&err,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            if (pLVar11 == (LayerNode *)0x0) {
              std::operator+(&err_4,"Failed to look up node for \'",&currentNodeName);
              std::operator+(&err_3,&err_4,"\'.");
              std::__cxx11::string::~string((string *)&err_4);
              CoreML::Result::Result
                        ((Result *)&layerName,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err_3);
              std::__cxx11::string::~string((string *)&err_3);
              bVar4 = false;
            }
            else {
              ppLVar1 = (pLVar11->parents).
                        super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (ppLVar14 = (pLVar11->parents).
                              super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppLVar14 != ppLVar1;
                  ppLVar14 = ppLVar14 + 1) {
                pLVar2 = *ppLVar14;
                std::__cxx11::string::string((string *)&err_3,(string *)&pLVar2->name);
                iVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find(&visitedLayersSet._M_t,&err_3);
                if ((_Rb_tree_header *)iVar12._M_node ==
                    &visitedLayersSet._M_t._M_impl.super__Rb_tree_header) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&visitedLayersSet,&err_3);
                  std::
                  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&r,&err_3);
                  if ((pLVar2->isUpdatable & bVar5) == 1) {
                    err_4._M_dataplus._M_p = (pointer)&err_4.field_2;
                    err_4._M_string_length = 0;
                    err_4.field_2._M_local_buf[0] = '\0';
                    std::operator+(&local_90,"There is a layer (",&firstNonBackpropogabaleLayerSeen)
                    ;
                    std::operator+(&local_50,&local_90,
                                   "), which does not support backpropagation, between an updatable marked layer and the loss function."
                                  );
                    std::__cxx11::string::operator=((string *)&err_4,(string *)&local_50);
                    std::__cxx11::string::~string((string *)&local_50);
                    std::__cxx11::string::~string((string *)&local_90);
                    CoreML::Result::Result
                              ((Result *)&layerName,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err_4);
                    std::__cxx11::string::~string((string *)&err_4);
                    std::__cxx11::string::~string((string *)&err_3);
                    bVar5 = 1;
                    bVar4 = false;
                    goto LAB_00567a38;
                  }
                  if ((pLVar2->isBackPropagable == false) &&
                     ((pLVar2->layerType != kSoftmax ||
                      (pLVar11->lossLayerType != kCategoricalCrossEntropyLossLayer)))) {
                    bVar5 = 1;
                    std::__cxx11::string::_M_assign((string *)&firstNonBackpropogabaleLayerSeen);
                  }
                }
                std::__cxx11::string::~string((string *)&err_3);
              }
              bVar4 = true;
            }
LAB_00567a38:
            std::__cxx11::string::~string((string *)&currentNodeName);
            if (!bVar4) {
              std::__cxx11::string::~string((string *)&firstNonBackpropogabaleLayerSeen);
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&r);
              std::__cxx11::string::~string((string *)&lossLayerName_1);
              goto LAB_00567aa9;
            }
          }
          std::__cxx11::string::~string((string *)&firstNonBackpropogabaleLayerSeen);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&r);
          std::__cxx11::string::~string((string *)&lossLayerName_1);
          iVar13 = iVar13 + 1;
        }
        CoreML::Result::Result((Result *)&layerName,(Result *)&err_1);
LAB_00567aa9:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&visitedLayersSet._M_t);
      }
      else {
LAB_00567a74:
        CoreML::Result::Result((Result *)&layerName,(Result *)&err_1);
      }
      goto LAB_00567ab6;
    }
    r._0_8_ = &r.m_message._M_string_length;
    r.m_message._M_dataplus._M_p = (pointer)0x0;
    r.m_message._M_string_length = r.m_message._M_string_length & 0xffffffffffffff00;
    std::__cxx11::string::assign((char *)&r);
    CoreML::Result::Result((Result *)&layerName,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)&r);
    std::__cxx11::string::~string((string *)&r);
LAB_00567ad0:
    std::__cxx11::string::~string((string *)&err_1._M_string_length);
    CoreML::Result::operator=(__return_storage_ptr__,(Result *)&layerName);
    std::__cxx11::string::~string((string *)&layerName._M_string_length);
    CoreML::Result::good(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateUpdatableNeuralNetwork(const T& nn) {
    
    Result r;

    r = validateUpdatableLayerSupport(nn);
    if (!r.good()) {return r;}
    
    r = validateLayerAndLossLayerNamesCollisions(nn);
    if (!r.good()) {return r;}

    r = isTrainingConfigurationSupported(nn);
    if (!r.good()) {return r;}
    
    return r;
}